

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCaseInstance::compare
          (BitsToFloatCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  deUint32 aBits;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar7;
  
  uVar3 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionTestInstance).m_spec.inputs.
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  uVar7 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  do {
    if (uVar5 == uVar7) {
LAB_00782d69:
      return (long)(int)uVar3 <= (long)uVar7;
    }
    uVar1 = *(uint *)((long)*inputs + uVar7 * 4);
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar1;
    uVar2 = *(uint *)((long)*outputs + uVar7 * 4);
    uVar6 = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      uVar6 = -(uVar2 - uVar1);
    }
    if (uVar6 != 0) {
      poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar7);
      poVar4 = std::operator<<(poVar4,"] = ");
      poVar4 = tcu::Format::operator<<(poVar4,hex);
      poVar4 = std::operator<<(poVar4," with ULP threshold ");
      poVar4 = tcu::Format::operator<<(poVar4,(Hex<8UL>)0x0);
      poVar4 = std::operator<<(poVar4,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = uVar6;
      tcu::Format::operator<<(poVar4,hex_00);
      goto LAB_00782d69;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			maxUlpDiff		= 0;

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const deUint32	ulpDiff		= getUlpDiff(in0, out0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(tcu::Float32(in0).bits()) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}